

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_grouping(lysc_ctx *ctx,lysp_node *pnode,lysp_node_grp *grp)

{
  bool bVar1;
  char *pcVar2;
  uint32_t uVar3;
  uint16_t uVar4;
  LY_ERR LVar5;
  int iVar6;
  uint32_t uVar7;
  void *pvVar8;
  lysp_node *plVar9;
  char *__fmt;
  long lVar10;
  uint64_t c__;
  void *pvVar11;
  char *path;
  lysp_node_uses fake_uses;
  lysc_node_container fake_container;
  char *local_118;
  char *local_110;
  anon_union_64_2_4724e097_for_lysp_node_uses_0 local_108;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined1 local_a8 [80];
  lysc_node *local_58;
  lysc_must *plStack_50;
  lysc_when **local_48;
  lysc_node_action *plStack_40;
  lysc_node_notif *local_38;
  
  uVar4 = 0;
  local_b8 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_108.node.iffeatures = (lysp_qname *)0x0;
  local_108.node.exts = (lysp_ext_instance *)0x0;
  local_108.node.dsc = (char *)0x0;
  local_108.node.ref = (char *)0x0;
  local_108.node.next = (lysp_node *)0x0;
  local_108._8_8_ = (ulong)CONCAT22((grp->field_0).node.flags,0x800) & 0xffffffff001cffff;
  local_108.node.name = (grp->field_0).node.name;
  local_a8._32_8_ = local_a8;
  local_38 = (lysc_node_notif *)0x0;
  local_48 = (lysc_when **)0x0;
  plStack_40 = (lysc_node_action *)0x0;
  local_58 = (lysc_node *)0x0;
  plStack_50 = (lysc_must *)0x0;
  local_a8._64_8_ = (lysc_ext_instance *)0x0;
  local_a8._72_8_ = (void *)0x0;
  local_a8._48_8_ = (char *)0x0;
  local_a8._56_8_ = (char *)0x0;
  local_a8._16_8_ = (lysc_node *)0x0;
  local_a8._24_8_ = (lysc_node *)0x0;
  local_a8._0_2_ = 1;
  local_a8._2_2_ = 0;
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8._8_8_ = ctx->cur_mod;
  local_a8._40_8_ = "fake";
  if (pnode != (lysp_node *)0x0) {
    uVar4 = pnode->flags;
  }
  local_108.node.parent = pnode;
  LVar5 = lys_compile_node_flags(ctx,uVar4,0,(lysc_node *)local_a8._32_8_);
  if (LVar5 == LY_SUCCESS) {
    if ((grp->field_0).node.parent != (lysp_node *)0x0) {
      ly_log(ctx->ctx,LY_LLWRN,LY_SUCCESS,"Locally scoped grouping \"%s\" not used.");
    }
    plVar9 = (grp->field_0).node.parent;
    local_118 = (char *)0x0;
    uVar7 = 0;
    uVar3 = 0;
    if (plVar9 != (lysp_node *)0x0) {
      do {
        uVar7 = uVar3;
        pcVar2 = local_118;
        uVar4 = plVar9->nodetype;
        if (uVar4 == 0x8000) {
          __fmt = "{augment=\'%s\'}";
LAB_0014ac72:
          bVar1 = false;
          iVar6 = asprintf(&local_110,__fmt);
          if (iVar6 != -1) goto LAB_0014ac90;
        }
        else {
          if (uVar4 == 0x4000) {
            __fmt = "{grouping=\'%s\'}";
            goto LAB_0014ac72;
          }
          if (uVar4 == 0x800) {
            __fmt = "{uses=\'%s\'}";
            goto LAB_0014ac72;
          }
          local_110 = strdup(plVar9->name);
LAB_0014ac90:
          if (plVar9->parent == (lysp_node *)0x0) {
            uVar7 = asprintf(&local_118,"/%s:%s%s",ctx->cur_mod->name);
          }
          else {
            uVar7 = asprintf(&local_118,"/%s%s",local_110);
          }
          free(pcVar2);
          free(local_110);
          bVar1 = true;
        }
        if (!bVar1) {
          uVar7 = 0xffffffff;
          goto LAB_0014ad56;
        }
        plVar9 = plVar9->parent;
      } while ((plVar9 != (lysp_node *)0x0) && (uVar3 = uVar7, -1 < (int)uVar7));
    }
    if ((int)uVar7 < 0) {
      free(local_118);
      local_118 = (char *)0x0;
    }
    else if (uVar7 == 0) {
      local_118 = strdup("/");
      uVar7 = 1;
    }
LAB_0014ad56:
    pcVar2 = local_118;
    if ((int)uVar7 < 0) {
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_grouping");
      return LY_EMEM;
    }
    strncpy(ctx->path,local_118,0xfed);
    ctx->path_len = uVar7;
    free(pcVar2);
    lysc_update_path(ctx,(lys_module *)0x0,"{grouping}");
    lysc_update_path(ctx,(lys_module *)0x0,(grp->field_0).node.name);
    LVar5 = lys_compile_uses(ctx,(lysp_node_uses *)&local_108.node,(lysc_node *)local_a8,0,
                             (ly_set *)0x0);
    lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
    ctx->path_len = 1;
    ctx->path[1] = '\0';
  }
  lysc_node_container_free(&ctx->free_ctx,(lysc_node_container *)local_a8);
  lVar10 = 0;
  pvVar11 = (void *)0x0;
  while( true ) {
    if ((lysc_ext_instance *)local_a8._64_8_ == (lysc_ext_instance *)0x0) {
      pvVar8 = (void *)0x0;
    }
    else {
      pvVar8 = ((lysc_ext_instance *)(local_a8._64_8_ + -0x48))->compiled;
    }
    if (pvVar8 <= pvVar11) break;
    lysc_ext_instance_free
              (&ctx->free_ctx,(lysc_ext_instance *)((long)(lysc_ext **)local_a8._64_8_ + lVar10));
    pvVar11 = (void *)((long)pvVar11 + 1);
    lVar10 = lVar10 + 0x48;
  }
  if ((lysc_ext_instance *)local_a8._64_8_ != (lysc_ext_instance *)0x0) {
    free(&((lysc_ext_instance *)(local_a8._64_8_ + -0x48))->compiled);
  }
  return LVar5;
}

Assistant:

LY_ERR
lys_compile_grouping(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysp_node_grp *grp)
{
    LY_ERR rc = LY_SUCCESS;
    char *path;
    int len;

    /* use grouping status to avoid errors */
    struct lysp_node_uses fake_uses = {
        .parent = pnode,
        .nodetype = LYS_USES,
        .flags = grp->flags & LYS_STATUS_MASK, .next = NULL,
        .name = grp->name,
        .dsc = NULL, .ref = NULL, .when = NULL, .iffeatures = NULL, .exts = NULL,
        .refines = NULL, .augments = NULL
    };
    struct lysc_node_container fake_container = {
        .nodetype = LYS_CONTAINER,
        .flags = 0,
        .module = ctx->cur_mod,
        .parent = NULL, .next = NULL,
        .prev = &fake_container.node,
        .name = "fake",
        .dsc = NULL, .ref = NULL, .exts = NULL, .when = NULL,
        .child = NULL, .musts = NULL, .actions = NULL, .notifs = NULL
    };

    /* compile fake container flags */
    LY_CHECK_GOTO(rc = lys_compile_node_flags(ctx, pnode ? pnode->flags : 0, 0, &fake_container.node), cleanup);

    if (grp->parent) {
        LOGWRN(ctx->ctx, "Locally scoped grouping \"%s\" not used.", grp->name);
    }

    len = lys_compile_grouping_pathlog(ctx, grp->parent, &path);
    if (len < 0) {
        LOGMEM(ctx->ctx);
        return LY_EMEM;
    }
    strncpy(ctx->path, path, LYSC_CTX_BUFSIZE - 1);
    ctx->path_len = (uint32_t)len;
    free(path);

    lysc_update_path(ctx, NULL, "{grouping}");
    lysc_update_path(ctx, NULL, grp->name);
    rc = lys_compile_uses(ctx, &fake_uses, &fake_container.node, 0, NULL);
    lysc_update_path(ctx, NULL, NULL);
    lysc_update_path(ctx, NULL, NULL);

    ctx->path_len = 1;
    ctx->path[1] = '\0';

cleanup:
    lysc_node_container_free(&ctx->free_ctx, &fake_container);
    FREE_ARRAY(&ctx->free_ctx, fake_container.exts, lysc_ext_instance_free);
    return rc;
}